

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O0

void Join<stTimeoutItem_t,stTimeoutItemLink_t>
               (stTimeoutItemLink_t *apLink,stTimeoutItemLink_t *apOther)

{
  stTimeoutItem_t *psVar1;
  stTimeoutItem_t *local_20;
  stTimeoutItem_t *lp;
  stTimeoutItemLink_t *apOther_local;
  stTimeoutItemLink_t *apLink_local;
  
  if (apOther->head != (stTimeoutItem_t *)0x0) {
    for (local_20 = apOther->head; local_20 != (stTimeoutItem_t *)0x0; local_20 = local_20->pNext) {
      local_20->pLink = apLink;
    }
    psVar1 = apOther->head;
    if (apLink->tail == (stTimeoutItem_t *)0x0) {
      apLink->head = apOther->head;
      apLink->tail = apOther->tail;
    }
    else {
      apLink->tail->pNext = psVar1;
      psVar1->pPrev = apLink->tail;
      apLink->tail = apOther->tail;
    }
    apOther->tail = (stTimeoutItem_t *)0x0;
    apOther->head = (stTimeoutItem_t *)0x0;
  }
  return;
}

Assistant:

void inline Join( TLink*apLink,TLink *apOther )
{
	//printf("apOther %p\n",apOther);
	if( !apOther->head )
	{
		return ;
	}
	TNode *lp = apOther->head;
	while( lp )
	{
		lp->pLink = apLink;
		lp = lp->pNext;
	}
	lp = apOther->head;
	if(apLink->tail)
	{
		apLink->tail->pNext = (TNode*)lp;
		lp->pPrev = apLink->tail;
		apLink->tail = apOther->tail;
	}
	else
	{
		apLink->head = apOther->head;
		apLink->tail = apOther->tail;
	}

	apOther->head = apOther->tail = NULL;
}